

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  int iVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint32_t uVar15;
  
  bVar7 = it->has_value;
  uVar15 = 0;
  do {
    if ((bVar7 & 1) == 0) {
      return uVar15;
    }
    uVar10 = count - uVar15;
    if (count < uVar15 || uVar10 == 0) {
      return uVar15;
    }
    uVar2 = it->typecode;
    if (uVar2 == '\x03') {
      piVar5 = (int *)it->container;
      lVar4 = *(long *)(piVar5 + 2);
      uVar10 = it->current_value;
      do {
        uVar14 = (uint)*(ushort *)(lVar4 + 2 + (long)it->run_index * 4) +
                 (uint)*(ushort *)(lVar4 + (long)it->run_index * 4) | it->highbits;
        uVar10 = (uVar14 - uVar10) + 1;
        uVar9 = count - uVar15;
        if (uVar10 < count - uVar15) {
          uVar9 = uVar10;
        }
        for (uVar12 = 0; uVar3 = it->current_value, uVar9 != uVar12; uVar12 = uVar12 + 1) {
          buf[uVar12] = uVar3 + (int)uVar12;
        }
        uVar10 = uVar3 + uVar9;
        it->current_value = uVar10;
        if (uVar14 <= (uVar3 + uVar9) - 1) {
          iVar1 = it->run_index;
          iVar11 = iVar1 + 1;
          it->run_index = iVar11;
          if (iVar11 < *piVar5) {
            uVar10 = (uint)*(ushort *)(lVar4 + 4 + (long)iVar1 * 4) | it->highbits;
            it->current_value = uVar10;
          }
          else {
            it->has_value = false;
            bVar7 = 0;
          }
        }
        buf = buf + uVar9;
        uVar15 = uVar15 + uVar9;
      } while ((uVar15 < count) && ((bVar7 & 1) != 0));
      if ((bVar7 & 1) != 0) goto LAB_00114274;
    }
    else if (uVar2 == '\x02') {
      piVar5 = (int *)it->container;
      uVar9 = *piVar5 - it->in_container_index;
      if (uVar10 <= uVar9) {
        uVar9 = uVar10;
      }
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        buf[uVar12] = (uint)*(ushort *)
                             (*(long *)(piVar5 + 2) +
                             (ulong)(uint)(it->in_container_index + (int)uVar12) * 2) | it->highbits
        ;
      }
      uVar15 = uVar15 + uVar9;
      iVar11 = it->in_container_index + uVar9;
      it->in_container_index = iVar11;
      iVar1 = *piVar5;
      it->has_value = iVar11 < iVar1;
      if (iVar11 < iVar1) {
        uVar10 = (uint)*(ushort *)(*(long *)(piVar5 + 2) + (long)iVar11 * 2);
        goto LAB_0011426c;
      }
      buf = buf + uVar9;
    }
    else {
      if (uVar2 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x41b3,
                      "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                     );
      }
      uVar8 = (long)it->in_container_index / 0x40 & 0xffffffff;
      bVar7 = (byte)(it->in_container_index % 0x40);
      lVar4 = *(long *)((long)it->container + 8);
      uVar12 = (*(ulong *)(lVar4 + uVar8 * 8) >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
      do {
        uVar10 = (int)uVar8 << 6;
        for (; (uVar12 != 0 && (uVar15 < count)); uVar15 = uVar15 + 1) {
          lVar6 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          *buf = (uint)lVar6 | uVar10 | it->highbits;
          uVar12 = uVar12 & uVar12 - 1;
          buf = buf + 1;
        }
        for (uVar13 = (ulong)((int)uVar8 + 1); (uVar12 == 0 && ((uint)uVar13 < 0x400));
            uVar13 = uVar13 + 1) {
          uVar12 = *(ulong *)(lVar4 + uVar13 * 8);
          uVar10 = uVar10 + 0x40;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      } while ((uVar12 != 0) && (uVar15 < count));
      it->has_value = uVar12 != 0;
      if (uVar12 != 0) {
        lVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar10 = (int)lVar4 + uVar10;
        it->in_container_index = uVar10;
LAB_0011426c:
        it->current_value = uVar10 | it->highbits;
LAB_00114274:
        if (uVar15 == count) {
          return count;
        }
        __assert_fail("ret == count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x41b6,
                      "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                     );
      }
    }
    it->container_index = it->container_index + 1;
    bVar7 = loadfirstvalue(it);
    it->has_value = (_Bool)bVar7;
  } while( true );
}

Assistant:

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it, uint32_t* buf, uint32_t count) {
  uint32_t ret = 0;
  uint32_t num_values;
  uint32_t wordindex;  // used for bitsets
  uint64_t word;       // used for bitsets
  const array_container_t* acont; //TODO remove
  const run_container_t* rcont; //TODO remove
  const bitset_container_t* bcont; //TODO remove

  while (it->has_value && ret < count) {
    switch (it->typecode) {
      case BITSET_CONTAINER_TYPE:
        bcont = const_CAST_bitset(it->container);
        wordindex = it->in_container_index / 64;
        word = bcont->words[wordindex] & (UINT64_MAX << (it->in_container_index % 64));
        do {
          while (word != 0 && ret < count) {
            buf[0] = it->highbits | (wordindex * 64 + __builtin_ctzll(word));
            word = word & (word - 1);
            buf++;
            ret++;
          }
          while (word == 0 && wordindex+1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
            wordindex++;
            word = bcont->words[wordindex];
          }
        } while (word != 0 && ret < count);
        it->has_value = (word != 0);
        if (it->has_value) {
          it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
          it->current_value = it->highbits | it->in_container_index;
        }
        break;
      case ARRAY_CONTAINER_TYPE:
        acont = const_CAST_array(it->container);
        num_values = minimum_uint32(acont->cardinality - it->in_container_index, count - ret);
        for (uint32_t i = 0; i < num_values; i++) {
          buf[i] = it->highbits | acont->array[it->in_container_index + i];
        }
        buf += num_values;
        ret += num_values;
        it->in_container_index += num_values;
        it->has_value = (it->in_container_index < acont->cardinality);
        if (it->has_value) {
          it->current_value = it->highbits | acont->array[it->in_container_index];
        }
        break;
      case RUN_CONTAINER_TYPE:
        rcont = const_CAST_run(it->container);
        //"in_run_index" name is misleading, read it as "max_value_in_current_run"
        do {
          uint32_t largest_run_value = it->highbits | (rcont->runs[it->run_index].value + rcont->runs[it->run_index].length);
          num_values = minimum_uint32(largest_run_value - it->current_value + 1, count - ret);
          for (uint32_t i = 0; i < num_values; i++) {
            buf[i] = it->current_value + i;
          }
          it->current_value += num_values; // this can overflow to zero: UINT32_MAX+1=0
          buf += num_values;
          ret += num_values;

          if (it->current_value > largest_run_value || it->current_value == 0) {
            it->run_index++;
            if (it->run_index < rcont->n_runs) {
              it->current_value = it->highbits | rcont->runs[it->run_index].value;
            } else {
              it->has_value = false;
            }
          }
        } while ((ret < count) && it->has_value);
        break;
      default:
        assert(false);
    }
    if (it->has_value) {
      assert(ret == count);
      return ret;
    }
    it->container_index++;
    it->has_value = loadfirstvalue(it);
  }
  return ret;
}